

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
          (RaceSuccessfulPromiseNodeBase *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises,
          ExceptionOrValue *output,SourceLocation location)

{
  ulong uVar1;
  Branch *pBVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *pRVar5;
  ArrayDisposer *pAVar6;
  size_t sVar7;
  ulong uVar8;
  Branch *pBVar9;
  Branch *pBVar10;
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> local_78;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *local_50;
  Branch *local_48;
  size_t local_40;
  ArrayDisposer *local_38;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0037f100;
  this->output = output;
  this->countLeft = (uint)promises->size_;
  (this->onReadyEvent).event = (Event *)0x0;
  this->armed = false;
  local_50 = &this->branches;
  (this->branches).ptr = (Branch *)0x0;
  (this->branches).size_ = 0;
  (this->branches).disposer = (ArrayDisposer *)0x0;
  sVar7 = promises->size_;
  local_78.ptr = (Branch *)
                 HeapArrayDisposer::allocateImpl
                           (0x50,0,sVar7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_78.endPtr = local_78.ptr + sVar7;
  local_78.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  uVar1 = promises->size_;
  pBVar9 = local_78.ptr;
  pBVar10 = local_78.ptr;
  if (uVar1 != 0) {
    uVar8 = 0;
    local_78.pos = local_78.ptr;
    do {
      ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::
      add<kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                (&local_78,this,promises->ptr + (uVar8 & 0xffffffff),&location);
      uVar8 = uVar8 + 1;
      pBVar9 = local_78.ptr;
      pBVar10 = local_78.pos;
    } while (uVar1 != uVar8);
  }
  pAVar6 = local_78.disposer;
  sVar7 = ((long)pBVar10 - (long)pBVar9 >> 4) * -0x3333333333333333;
  local_78.ptr = (Branch *)0x0;
  local_78.pos = (RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)0x0;
  local_78.endPtr = (Branch *)0x0;
  pBVar2 = local_50->ptr;
  local_48 = pBVar9;
  local_40 = sVar7;
  local_38 = local_78.disposer;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (this->branches).size_;
    local_50->ptr = (Branch *)0x0;
    local_50->size_ = 0;
    pAVar4 = (this->branches).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pBVar2,0x50,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::destruct);
  }
  (this->branches).ptr = pBVar9;
  (this->branches).size_ = sVar7;
  (this->branches).disposer = pAVar6;
  if (pBVar10 == pBVar9) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  pBVar10 = local_78.endPtr;
  pRVar5 = local_78.pos;
  pBVar9 = local_78.ptr;
  if (local_78.ptr != (Branch *)0x0) {
    local_78.ptr = (Branch *)0x0;
    local_78.pos = (RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)0x0;
    local_78.endPtr = (Branch *)0x0;
    (*(code *)**(undefined8 **)local_78.disposer)
              (local_78.disposer,pBVar9,0x50,
               ((long)pRVar5 - (long)pBVar9 >> 4) * -0x3333333333333333,
               ((long)pBVar10 - (long)pBVar9 >> 4) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::destruct);
  }
  return;
}

Assistant:

RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase(
    Array<OwnPromiseNode> promises, ExceptionOrValue &output,
    SourceLocation location)
    : output(output), countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i : indices(promises)) {
    builder.add(*this, kj::mv(promises[i]), location);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}